

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

void boost::deflate::inflate_stream_test::testInflate(IDecompressor *d)

{
  Matrix *pMVar1;
  size_t n;
  size_t n_00;
  size_t n_01;
  size_t n_02;
  size_t n_03;
  size_t n_04;
  size_t n_05;
  error_code expected;
  error_code expected_00;
  inflate_stream_test *this;
  initializer_list<unsigned_char> *local_370;
  error_category *local_368;
  _func_int *local_35e [5];
  IDecompressor local_330;
  undefined8 local_328;
  string local_320;
  initializer_list<unsigned_char> *local_300;
  error_category *local_2f8;
  undefined1 local_2ee;
  undefined1 local_2ed;
  undefined1 local_2ec;
  undefined1 local_2eb;
  undefined1 local_2ea;
  undefined1 local_2e9;
  IDecompressor local_2e8;
  undefined8 local_2e0;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  Boost local_28c;
  char *local_280;
  char *check_8;
  Matrix m_8;
  undefined1 local_250 [8];
  string check_7;
  Matrix m_7;
  undefined1 local_208 [8];
  string check_6;
  Matrix m_6;
  undefined1 local_1c0 [8];
  string check_5;
  Matrix m_5;
  undefined1 local_178 [8];
  string check_4;
  Matrix m_4;
  undefined1 local_130 [8];
  string check_3;
  Matrix m_3;
  undefined1 local_e8 [8];
  string check_2;
  Matrix m_2;
  undefined1 local_a0 [8];
  string check_1;
  Matrix m_1;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string check;
  Matrix m;
  IDecompressor *d_local;
  
  Matrix::Matrix((Matrix *)((long)&check.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,
             "{\n   \"AutobahnPython/0.6.0\": {\n      \"1.1.1\": {\n         \"behavior\": \"OK\",\n         \"behaviorClose\": \"OK\",\n         \"duration\": 2,\n         \"remoteCloseCode\": 1000,\n         \"reportfile\": \"autobahnpython_0_6_0_case_1_1_1.json\"\n"
             ,&local_49);
  std::allocator<char>::~allocator(&local_49);
  Boost::Boost((Boost *)m_1.strategy_,half,half,sync);
  Matrix::operator()((Matrix *)((long)&check.field_2 + 8),(Boost *)m_1.strategy_,(string *)local_48)
  ;
  std::__cxx11::string::~string((string *)local_48);
  Matrix::Matrix((Matrix *)((long)&check_1.field_2 + 8));
  corpus1_abi_cxx11_((string *)local_a0,(inflate_stream_test *)0x1388,n);
  Boost::Boost((Boost *)m_2.strategy_,half,half,sync);
  Matrix::operator()((Matrix *)((long)&check_1.field_2 + 8),(Boost *)m_2.strategy_,
                     (string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  Matrix::Matrix((Matrix *)((long)&check_2.field_2 + 0xc));
  corpus2_abi_cxx11_((string *)local_e8,(inflate_stream_test *)0x1388,n_00);
  Boost::Boost((Boost *)m_3.strategy_,half,half,sync);
  Matrix::operator()((Matrix *)((long)&check_2.field_2 + 0xc),(Boost *)m_3.strategy_,
                     (string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  pMVar1 = (Matrix *)((long)&check_3.field_2 + 0xc);
  Matrix::Matrix(pMVar1);
  corpus1_abi_cxx11_((string *)local_130,(inflate_stream_test *)0x3e8,n_01);
  Matrix::level(pMVar1,6);
  Matrix::window((Matrix *)((long)&check_3.field_2 + 0xc),9);
  Matrix::strategy((Matrix *)((long)&check_3.field_2 + 0xc),0);
  Boost::Boost((Boost *)m_4.strategy_,once,full,sync);
  Matrix::operator()((Matrix *)((long)&check_3.field_2 + 0xc),(Boost *)m_4.strategy_,
                     (string *)local_130);
  std::__cxx11::string::~string((string *)local_130);
  pMVar1 = (Matrix *)((long)&check_4.field_2 + 0xc);
  Matrix::Matrix(pMVar1);
  corpus2_abi_cxx11_((string *)local_178,(inflate_stream_test *)0x3e8,n_02);
  Matrix::level(pMVar1,6);
  Matrix::window((Matrix *)((long)&check_4.field_2 + 0xc),9);
  Matrix::strategy((Matrix *)((long)&check_4.field_2 + 0xc),0);
  Boost::Boost((Boost *)m_5.strategy_,once,full,sync);
  Matrix::operator()((Matrix *)((long)&check_4.field_2 + 0xc),(Boost *)m_5.strategy_,
                     (string *)local_178);
  std::__cxx11::string::~string((string *)local_178);
  pMVar1 = (Matrix *)((long)&check_5.field_2._M_allocated_capacity + 0xc);
  Matrix::Matrix(pMVar1);
  Matrix::level(pMVar1,6);
  Matrix::window(pMVar1,9);
  corpus1_abi_cxx11_((string *)local_1c0,(inflate_stream_test *)0xc8,n_03);
  Boost::Boost((Boost *)m_6.strategy_,full,full,sync);
  Matrix::operator()((Matrix *)((long)&check_5.field_2 + 0xc),(Boost *)m_6.strategy_,
                     (string *)local_1c0);
  std::__cxx11::string::~string((string *)local_1c0);
  pMVar1 = (Matrix *)((long)&check_6.field_2._M_allocated_capacity + 0xc);
  Matrix::Matrix(pMVar1);
  Matrix::level(pMVar1,6);
  Matrix::window(pMVar1,9);
  corpus2_abi_cxx11_((string *)local_208,(inflate_stream_test *)0x1f4,n_04);
  Boost::Boost((Boost *)m_7.strategy_,full,full,sync);
  Matrix::operator()((Matrix *)((long)&check_6.field_2 + 0xc),(Boost *)m_7.strategy_,
                     (string *)local_208);
  std::__cxx11::string::~string((string *)local_208);
  pMVar1 = (Matrix *)((long)&check_7.field_2 + 0xc);
  Matrix::Matrix(pMVar1);
  corpus2_abi_cxx11_((string *)local_250,(inflate_stream_test *)0x3e8,n_05);
  Matrix::level(pMVar1,6);
  Matrix::window((Matrix *)((long)&check_7.field_2 + 0xc),9);
  Matrix::strategy((Matrix *)((long)&check_7.field_2 + 0xc),0);
  Boost::Boost((Boost *)m_8.strategy_,full,once,block);
  Matrix::operator()((Matrix *)((long)&check_7.field_2 + 0xc),(Boost *)m_8.strategy_,
                     (string *)local_250);
  std::__cxx11::string::~string((string *)local_250);
  pMVar1 = (Matrix *)((long)&check_8 + 4);
  Matrix::Matrix(pMVar1);
  local_280 = 
  "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ultricies mi eget mauris pharetra et ultrices neque ornare. Eget est lorem ipsum dolor. Dui faucibus in ornare quam viverra orci sagittis. Lorem mollis aliquam ut porttitor. Pretium quam vulputate dignissim suspendisse in est ante in. Tempus egestas sed sed risus pretium quam vulputate dignissim. Pellentesque dignissim enim sit amet venenatis urna. Eleifend quam adipiscing vitae proin sagittis nisl rhoncus. Aliquam etiam erat velit scelerisque in. Accumsan in nisl nisi scelerisque eu ultrices vitae auctor eu."
  ;
  Matrix::level(pMVar1,6);
  Matrix::window(pMVar1,9);
  Matrix::strategy(pMVar1,0);
  Boost::Boost(&local_28c,full,full,sync);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,
             "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ultricies mi eget mauris pharetra et ultrices neque ornare. Eget est lorem ipsum dolor. Dui faucibus in ornare quam viverra orci sagittis. Lorem mollis aliquam ut porttitor. Pretium quam vulputate dignissim suspendisse in est ante in. Tempus egestas sed sed risus pretium quam vulputate dignissim. Pellentesque dignissim enim sit amet venenatis urna. Eleifend quam adipiscing vitae proin sagittis nisl rhoncus. Aliquam etiam erat velit scelerisque in. Accumsan in nisl nisi scelerisque eu ultrices vitae auctor eu."
             ,&local_2b1);
  Matrix::operator()((Matrix *)((long)&check_8 + 4),&local_28c,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  local_2ee = 99;
  local_2ed = 0x18;
  local_2ec = 5;
  local_2eb = 0x40;
  local_2ea = 0xc;
  local_2e9 = 0;
  local_2e8._vptr_IDecompressor = (_func_int **)&local_2ee;
  local_2e0 = 6;
  this = (inflate_stream_test *)d;
  system::error_code::error_code((error_code *)&local_300);
  expected.cat_ = (error_category *)0x0;
  expected._0_8_ = local_2f8;
  check_abi_cxx11_(&local_2d8,this,&local_2e8,local_300,expected,8,3,(size_t)this);
  std::__cxx11::string::~string((string *)&local_2d8);
  memset(local_35e,0,0x2e);
  memcpy(local_35e,&DAT_001381e5,0x2e);
  local_330._vptr_IDecompressor = local_35e;
  local_328 = 0x2e;
  system::error_code::error_code((error_code *)&local_370);
  expected_00.cat_ = (error_category *)0x0;
  expected_00._0_8_ = local_368;
  check_abi_cxx11_(&local_320,(inflate_stream_test *)d,&local_330,local_370,expected_00,0xf,
                   0xffffffffffffffff,(size_t)this);
  std::__cxx11::string::~string((string *)&local_320);
  return;
}

Assistant:

static
    void testInflate(IDecompressor& d)
    {
        {
            Matrix m{};
            std::string check =
                "{\n   \"AutobahnPython/0.6.0\": {\n"
                "      \"1.1.1\": {\n"
                "         \"behavior\": \"OK\",\n"
                "         \"behaviorClose\": \"OK\",\n"
                "         \"duration\": 2,\n"
                "         \"remoteCloseCode\": 1000,\n"
                "         \"reportfile\": \"autobahnpython_0_6_0_case_1_1_1.json\"\n"
                ;
            m(Boost{half, half}, check);
        }

        {
            Matrix m{};
            auto const check = corpus1(5000);
            m(Boost{half, half}, check);
        }
        {
            Matrix m{};
            auto const check = corpus2(5000);
            m(Boost{half, half}, check);
        }
        {
            Matrix m{};
            auto const check = corpus1(1000);
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{once, full}, check);
        }
        {
            Matrix m{};
            auto const check = corpus2(1000);
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{once, full}, check);
        }
        {
            Matrix m{};
            m.level(6);
            m.window(9);
            auto const check = corpus1(200);
            m(Boost{full, full}, check);
        }
        {
            Matrix m{};
            m.level(6);
            m.window(9);
            auto const check = corpus2(500);
            m(Boost{full, full}, check);
        }
        {
            Matrix m{};
            auto const check = corpus2(1000);
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{full, once, Flush::block}, check);
        }
        {
            // Check a known string - this provides more stable coverage,
            // independent of the RNG-generated strings.
            Matrix m{};
            auto const check =
                "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do "
                "eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                "Ultricies mi eget mauris pharetra et ultrices neque ornare. Eget est "
                "lorem ipsum dolor. Dui faucibus in ornare quam viverra orci "
                "sagittis. Lorem mollis aliquam ut porttitor. Pretium quam vulputate "
                "dignissim suspendisse in est ante in. Tempus egestas sed sed risus "
                "pretium quam vulputate dignissim. Pellentesque dignissim enim sit "
                "amet venenatis urna. Eleifend quam adipiscing vitae proin sagittis "
                "nisl rhoncus. Aliquam etiam erat velit scelerisque in. Accumsan in "
                "nisl nisi scelerisque eu ultrices vitae auctor eu.";
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{full, full}, check);
        }

// ASTUN: Always fails on AppleClang and MSVC; still not sure why
#if 0
        {
            Matrix m{};
            auto const check2 = corpus2(10000);
            //auto const check2 = std::string{"Text"};
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{full, once, Flush::trees}, check2);
        }
#endif
        check(d, {0x63, 0x18, 0x05, 0x40, 0x0c, 0x00}, {},boost::deflate::wrap::none, 8, 3);
        check(d, {0xed, 0xc0, 0x81, 0x00, 0x00, 0x00, 0x00, 0x80,
               0xa0, 0xfd, 0xa9, 0x17, 0xa9, 0x00, 0x00, 0x00,
               0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
               0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
               0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
               0x00, 0x00, 0x00, 0x00, 0x00, 0x06}, {});
    }